

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void __thiscall embree::CommandLine::CommandLine(CommandLine *this,int argc,char **argv)

{
  vector<char*,std::allocator<char*>> *this_00;
  iterator __position;
  string *psVar1;
  long lVar2;
  pointer *__ptr;
  pair<std::__detail::_Node_iterator<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>,_true,_false>,_bool>
  pVar3;
  pair<std::__detail::_Node_iterator<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false>,_bool>
  pVar4;
  string *local_48;
  allocator local_39;
  char **local_38;
  
  this->cl = (vector<char_*,_std::allocator<char_*>_> *)0x0;
  local_38 = argv;
  local_48 = (string *)operator_new(0x18);
  *(undefined8 *)local_48 = 0;
  *(undefined8 *)(local_48 + 8) = 0;
  *(undefined8 *)(local_48 + 0x10) = 0;
  pVar3 = std::
          _Hashtable<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>,std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>,std::allocator<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>,std::hash<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_emplace<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>
                    ((_Hashtable<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>,std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>,std::allocator<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>,std::hash<std::unique_ptr<std::vector<char*,std::allocator<char*>>,std::default_delete<std::vector<char*,std::allocator<char*>>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)command_line_pool);
  psVar1 = local_48;
  if (local_48 != (string *)0x0) {
    if (*(void **)local_48 != (void *)0x0) {
      operator_delete(*(void **)local_48);
    }
    operator_delete(psVar1);
  }
  this->cl = *(vector<char_*,_std::allocator<char_*>_> **)
              ((long)pVar3.first.
                     super__Node_iterator_base<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>,_false>
                     ._M_cur.
                     super__Node_iterator_base<std::unique_ptr<std::vector<char_*,_std::allocator<char_*>_>,_std::default_delete<std::vector<char_*,_std::allocator<char_*>_>_>_>,_false>
              + 8);
  if (argc != 0) {
    lVar2 = 0;
    do {
      psVar1 = (string *)operator_new(0x20);
      std::__cxx11::string::string(psVar1,local_38[lVar2],&local_39);
      local_48 = psVar1;
      pVar4 = std::
              _Hashtable<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,std::hash<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_emplace<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>
                        ((_Hashtable<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::allocator<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,std::__detail::_Identity,std::equal_to<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,std::hash<std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)string_pool_abi_cxx11_,&local_48);
      psVar1 = local_48;
      if (local_48 != (string *)0x0) {
        if (*(string **)local_48 != local_48 + 0x10) {
          operator_delete(*(string **)local_48);
        }
        operator_delete(psVar1);
      }
      this_00 = (vector<char*,std::allocator<char*>> *)this->cl;
      local_48 = (string *)
                 **(undefined8 **)
                   ((long)pVar4.first.
                          super__Node_iterator_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                          ._M_cur.
                          super__Node_iterator_base<std::unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
                   + 8);
      __position._M_current = *(char ***)(this_00 + 8);
      if (__position._M_current == *(char ***)(this_00 + 0x10)) {
        std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*>
                  (this_00,__position,(char **)&local_48);
      }
      else {
        *__position._M_current = (char *)local_48;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      lVar2 = lVar2 + 1;
    } while (argc != lVar2);
  }
  return;
}

Assistant:

CommandLine(int argc, char** argv) : cl(nullptr)
  {
    auto cl_iter = command_line_pool.emplace(std::unique_ptr<std::vector<char*>>(new std::vector<char*>()));
    cl = cl_iter.first->get();
    for (size_t i = 0; i < argc; ++i) {
      auto pair = string_pool.emplace(std::unique_ptr<std::string>{new std::string(argv[i])});
      cl->emplace_back(&(*pair.first->get())[0]);
    }
  }